

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O0

void cuddXorLinear(DdManager *table,int x,int y)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  long *linear;
  int ystart;
  int xstart;
  int wordsPerRow;
  int nvars;
  int i;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  iVar2 = (table->size + -1 >> 6) + 1;
  plVar1 = table->linear;
  for (wordsPerRow = 0; wordsPerRow < iVar2; wordsPerRow = wordsPerRow + 1) {
    iVar3 = iVar2 * x + wordsPerRow;
    plVar1[iVar3] = plVar1[iVar2 * y + wordsPerRow] ^ plVar1[iVar3];
  }
  return;
}

Assistant:

static void
cuddXorLinear(
  DdManager * table,
  int  x,
  int  y)
{
    int i;
    int nvars = table->size;
    int wordsPerRow = ((nvars - 1) >> LOGBPL) + 1;
    int xstart = wordsPerRow * x;
    int ystart = wordsPerRow * y;
    long *linear = table->linear;

    for (i = 0; i < wordsPerRow; i++) {
        linear[xstart+i] ^= linear[ystart+i];
    }

}